

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

int __thiscall
IDisk::AddMFMByteToAllTrack(IDisk *this,int side,int track,uint index,uchar byte,int datasize)

{
  MFMTrack *pMVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  if (0 < datasize) {
    uVar3 = datasize - 1;
    do {
      pMVar1 = this->side_[side].tracks;
      uVar2 = (ulong)index;
      if (pMVar1[track].size <= index) {
        uVar2 = 0;
      }
      pMVar1[track].bitfield[uVar2] = (byte >> (uVar3 & 0x1f) & 1) != 0;
      index = (int)uVar2 + 1;
      bVar4 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar4);
    return index;
  }
  return index;
}

Assistant:

int IDisk::AddMFMByteToAllTrack(int side, int track, unsigned int index, unsigned char byte, int datasize)
{
   for (int d = 0; d < datasize; d++)
   {
      if (index >= side_[side].tracks[track].size)
      {
         index = 0;
      }
      side_[side].tracks[track].bitfield[index++] = ((byte >> (datasize - 1 - d)) & 0x01);
   }
   return index;
}